

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O2

void bs_predict_mean(vw *all,example *ec,vector<double,_std::allocator<double>_> *pred_vec)

{
  float fVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  float extraout_XMM0_Da;
  double dVar5;
  
  pdVar3 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar5 = 0.0;
  pdVar2 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar4 = pdVar2; pdVar4 != pdVar3; pdVar4 = pdVar4 + 1) {
    dVar5 = dVar5 + *pdVar4;
  }
  (ec->pred).scalar = (float)dVar5 / (float)(ulong)((long)pdVar3 - (long)pdVar2 >> 3);
  if ((0.0 < ec->weight) && ((fVar1 = (ec->l).simple.label, fVar1 != 3.4028235e+38 || (NAN(fVar1))))
     ) {
    (*all->loss->_vptr_loss_function[1])(all->loss,all->sd);
    ec->loss = extraout_XMM0_Da * ec->weight;
  }
  return;
}

Assistant:

void bs_predict_mean(vw& all, example& ec, vector<double>& pred_vec)
{
  ec.pred.scalar = (float)accumulate(pred_vec.cbegin(), pred_vec.cend(), 0.0) / pred_vec.size();
  if (ec.weight > 0 && ec.l.simple.label != FLT_MAX)
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ec.l.simple.label) * ec.weight;
}